

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::checkOptions(QHexView *this)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  QPalette *this_00;
  QColor *pQVar4;
  uint local_14;
  QHexView *local_10;
  QHexView *this_local;
  
  if ((this->m_options).linelength < (this->m_options).grouplength) {
    (this->m_options).grouplength = (this->m_options).linelength;
  }
  local_10 = this;
  local_14 = calcAddressWidth(this);
  puVar3 = qMax<unsigned_int>(&(this->m_options).addresswidth,&local_14);
  (this->m_options).addresswidth = *puVar3;
  iVar2 = qFloor<double>((double)(this->m_options).grouplength / 2.0);
  (this->m_options).grouplength = 1 << ((byte)iVar2 & 0x1f);
  if ((this->m_options).grouplength < 2) {
    (this->m_options).grouplength = 1;
  }
  bVar1 = QColor::isValid(&(this->m_options).headercolor);
  if (!bVar1) {
    this_00 = (QPalette *)QWidget::palette();
    pQVar4 = QPalette::color(this_00,Active,Highlight);
    *(undefined8 *)&(this->m_options).headercolor = *(undefined8 *)pQVar4;
    *(undefined4 *)((long)&(this->m_options).headercolor.ct + 4) =
         *(undefined4 *)((long)&pQVar4->ct + 4);
    (this->m_options).headercolor.ct.argb.pad = (pQVar4->ct).argb.pad;
  }
  return;
}

Assistant:

void QHexView::checkOptions() {
    if(m_options.grouplength > m_options.linelength)
        m_options.grouplength = m_options.linelength;

    m_options.addresswidth =
        qMax<unsigned int>(m_options.addresswidth, this->calcAddressWidth());

    // Round to nearest multiple of 2
    m_options.grouplength =
        1u << (static_cast<unsigned int>(qFloor(m_options.grouplength / 2.0)));

    if(m_options.grouplength <= 1)
        m_options.grouplength = 1;

    if(!m_options.headercolor.isValid())
        m_options.headercolor =
            this->palette().color(QPalette::Normal, QPalette::Highlight);
}